

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * strip_absolute_path(bsdtar *bsdtar,char *p)

{
  char *c;
  bool bVar1;
  char *rp;
  char *p_local;
  bsdtar *bsdtar_local;
  
  rp = p;
  if (((((*p == '/') || (*p == '\\')) && ((p[1] == '/' || (p[1] == '\\')))) &&
      ((p[2] == '.' || (p[2] == '?')))) && ((p[3] == '/' || (p[3] == '\\')))) {
    if ((((p[2] == '?') && ((p[4] == 'U' || (p[4] == 'u')))) && ((p[5] == 'N' || (p[5] == 'n')))) &&
       (((p[6] == 'C' || (p[6] == 'c')) && ((p[7] == '/' || (p[7] == '\\')))))) {
      rp = p + 8;
    }
    else {
      rp = p + 4;
    }
    warn_strip_drive_letter(bsdtar);
  }
  do {
    c = rp;
    if (((('`' < *rp) && (*rp < '{')) || (('@' < *rp && (*rp < '[')))) && (rp[1] == ':')) {
      rp = rp + 2;
      warn_strip_drive_letter(bsdtar);
    }
    while( true ) {
      bVar1 = true;
      if (*rp != '/') {
        bVar1 = *rp == '\\';
      }
      if (!bVar1) break;
      if (((rp[1] == '.') && (rp[2] == '.')) && ((rp[3] == '/' || (rp[3] == '\\')))) {
        rp = rp + 3;
      }
      else if ((rp[1] == '.') && ((rp[2] == '/' || (rp[2] == '\\')))) {
        rp = rp + 2;
      }
      else {
        rp = rp + 1;
      }
      warn_strip_leading_char(bsdtar,c);
    }
  } while (c != rp);
  return rp;
}

Assistant:

static const char*
strip_absolute_path(struct bsdtar *bsdtar, const char *p)
{
	const char *rp;

	/* Remove leading "//./" or "//?/" or "//?/UNC/"
	 * (absolute path prefixes used by Windows API) */
	if ((p[0] == '/' || p[0] == '\\') &&
	    (p[1] == '/' || p[1] == '\\') &&
	    (p[2] == '.' || p[2] == '?') &&
	    (p[3] == '/' || p[3] == '\\'))
	{
		if (p[2] == '?' &&
		    (p[4] == 'U' || p[4] == 'u') &&
		    (p[5] == 'N' || p[5] == 'n') &&
		    (p[6] == 'C' || p[6] == 'c') &&
		    (p[7] == '/' || p[7] == '\\'))
			p += 8;
		else
			p += 4;
		warn_strip_drive_letter(bsdtar);
	}

	/* Remove multiple leading slashes and Windows drive letters. */
	do {
		rp = p;
		if (((p[0] >= 'a' && p[0] <= 'z') ||
		     (p[0] >= 'A' && p[0] <= 'Z')) &&
		    p[1] == ':') {
			p += 2;
			warn_strip_drive_letter(bsdtar);
		}

		/* Remove leading "/../", "/./", "//", etc. */
		while (p[0] == '/' || p[0] == '\\') {
			if (p[1] == '.' &&
			    p[2] == '.' &&
			    (p[3] == '/' || p[3] == '\\')) {
				p += 3; /* Remove "/..", leave "/" for next pass. */
			} else if (p[1] == '.' &&
				   (p[2] == '/' || p[2] == '\\')) {
				p += 2; /* Remove "/.", leave "/" for next pass. */
			} else
				p += 1; /* Remove "/". */
			warn_strip_leading_char(bsdtar, rp);
		}
	} while (rp != p);

	return (p);
}